

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helpers.cc
# Opt level: O1

bool google::protobuf::compiler::cpp::CanInitializeByZeroing
               (FieldDescriptor *field,Options *options,MessageSCCAnalyzer *scc_analyzer)

{
  FieldDescriptor FVar1;
  uint uVar2;
  string_view name;
  long lVar3;
  string *psVar4;
  bool bVar5;
  Descriptor *descriptor;
  undefined1 uVar6;
  undefined1 *puVar7;
  undefined1 *puVar8;
  byte bVar9;
  char *pcVar10;
  undefined1 uStack_f0;
  undefined7 uStack_ef;
  string sStack_e0;
  AlphaNum AStack_c0;
  AlphaNum AStack_90;
  undefined1 *puStack_60;
  undefined1 auStack_48 [16];
  code *pcStack_38;
  undefined1 auStack_30 [16];
  FieldDescriptor *pFStack_20;
  undefined1 auStack_18 [16];
  
  puVar7 = auStack_18;
  FVar1 = field[1];
  bVar5 = (bool)(((byte)FVar1 & 0x20) >> 5);
  if (0xbf < (byte)FVar1 == bVar5) {
    psVar4 = (string *)0x0;
  }
  else {
    pFStack_20 = (FieldDescriptor *)0x1e5bfc;
    psVar4 = absl::lts_20240722::log_internal::MakeCheckOpString<bool,bool>
                       (bVar5,0xbf < (byte)FVar1,"is_repeated_ == label() == LABEL_REPEATED");
  }
  if (psVar4 != (string *)0x0) {
    pFStack_20 = (FieldDescriptor *)CanClearByZeroing;
    CanInitializeByZeroing();
    puVar8 = auStack_30;
    bVar9 = puVar7[1];
    bVar5 = (bool)((bVar9 & 0x20) >> 5);
    pFStack_20 = field;
    if (0xbf < bVar9 == bVar5) {
      psVar4 = (string *)0x0;
    }
    else {
      pcStack_38 = (code *)0x1e5cc9;
      psVar4 = absl::lts_20240722::log_internal::MakeCheckOpString<bool,bool>
                         (bVar5,0xbf < bVar9,"is_repeated_ == label() == LABEL_REPEATED");
    }
    if (psVar4 != (string *)0x0) {
      pcStack_38 = HasTrivialSwap;
      CanClearByZeroing();
      uVar6 = SUB81(auStack_48,0);
      bVar9 = puVar8[1];
      bVar5 = (bool)((bVar9 & 0x20) >> 5);
      pcStack_38 = (code *)puVar7;
      if (0xbf < bVar9 == bVar5) {
        psVar4 = (string *)0x0;
      }
      else {
        psVar4 = absl::lts_20240722::log_internal::MakeCheckOpString<bool,bool>
                           (bVar5,0xbf < bVar9,"is_repeated_ == label() == LABEL_REPEATED");
      }
      if (psVar4 != (string *)0x0) {
        HasTrivialSwap();
        pcVar10 = (char *)0x0;
        uStack_f0 = 0;
        puVar7 = &uStack_f0;
        puStack_60 = puVar8;
        if (*(cpp **)(psVar4 + 0x18) != (cpp *)0x0) {
          ClassName_abi_cxx11_(&sStack_e0,*(cpp **)(psVar4 + 0x18),descriptor);
          AStack_c0.piece_._M_len = sStack_e0._M_string_length;
          AStack_c0.piece_._M_str = sStack_e0._M_dataplus._M_p;
          AStack_90.piece_._M_len = 1;
          AStack_90.piece_._M_str = "_";
          absl::lts_20240722::StrAppend((string *)&stack0xffffffffffffff00,&AStack_c0,&AStack_90);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)sStack_e0._M_dataplus._M_p != &sStack_e0.field_2) {
            operator_delete(sStack_e0._M_dataplus._M_p,sStack_e0.field_2._M_allocated_capacity + 1);
          }
        }
        AStack_c0.piece_._M_str = (char *)**(undefined8 **)(psVar4 + 8);
        AStack_c0.piece_._M_len = (*(undefined8 **)(psVar4 + 8))[1];
        absl::lts_20240722::StrAppend((string *)&stack0xffffffffffffff00,&AStack_c0);
        if (*(char *)(*(long *)(psVar4 + 0x20) + 0x53) == '\x01') {
          AStack_c0.piece_._M_len = 9;
          AStack_c0.piece_._M_str = "_DoNotUse";
          absl::lts_20240722::StrAppend((string *)&stack0xffffffffffffff00,&AStack_c0);
        }
        name._M_str = pcVar10;
        name._M_len = (size_t)puVar7;
        ResolveKeyword_abi_cxx11_(name);
        if (puVar7 != &uStack_f0) {
          operator_delete(puVar7,CONCAT71(uStack_ef,uStack_f0) + 1);
        }
        return (bool)uVar6;
      }
      if (((puVar8[1] & 0x28) == 0) &&
         (uVar2 = *(uint *)((long)&FieldDescriptor::kTypeToCppTypeMap + (ulong)(byte)puVar8[2] * 4),
         uVar2 < 0xb)) {
        bVar9 = (byte)(0x5fe >> ((byte)uVar2 & 0x1f));
      }
      else {
        bVar9 = 0;
      }
      return (bool)(bVar9 & 1);
    }
    if ((puVar7[1] & 0x28) != 0) {
LAB_001e5cac:
      return false;
    }
    switch(*(undefined4 *)((long)&FieldDescriptor::kTypeToCppTypeMap + (ulong)(byte)puVar7[2] * 4))
    {
    case 1:
    case 3:
      bVar9 = *(int *)(puVar7 + 0x50) == 0;
      break;
    case 2:
    case 4:
      bVar9 = *(long *)(puVar7 + 0x50) == 0;
      break;
    case 5:
      bVar5 = *(double *)(puVar7 + 0x50) == 0.0;
      goto LAB_001e5ca2;
    case 6:
      bVar5 = *(float *)(puVar7 + 0x50) == 0.0;
LAB_001e5ca2:
      bVar9 = -bVar5 & 1;
      break;
    case 7:
      bVar9 = puVar7[0x50] ^ 1;
      break;
    case 8:
      pcStack_38 = (code *)0x1e5c8c;
      lVar3 = google::protobuf::FieldDescriptor::default_value_enum();
      bVar9 = *(int *)(lVar3 + 4) == 0;
      break;
    default:
      goto LAB_001e5cac;
    }
    return (bool)bVar9;
  }
  if (((byte)field[1] & 0x28) != 0) {
LAB_001e5bdf:
    return false;
  }
  switch(*(undefined4 *)((long)&FieldDescriptor::kTypeToCppTypeMap + (ulong)(byte)field[2] * 4)) {
  case 1:
  case 3:
    bVar9 = *(int *)(field + 0x50) == 0;
    break;
  case 2:
  case 4:
    bVar9 = *(long *)(field + 0x50) == 0;
    break;
  case 5:
    bVar5 = *(double *)(field + 0x50) == 0.0;
    goto LAB_001e5bd8;
  case 6:
    bVar5 = *(float *)(field + 0x50) == 0.0;
LAB_001e5bd8:
    bVar9 = -bVar5 & 1;
    break;
  case 7:
    bVar9 = (byte)field[0x50] ^ 1;
    break;
  case 8:
    pFStack_20 = (FieldDescriptor *)0x1e5bc0;
    lVar3 = google::protobuf::FieldDescriptor::default_value_enum();
    bVar9 = *(int *)(lVar3 + 4) == 0;
    break;
  default:
    goto LAB_001e5bdf;
  case 10:
    bVar9 = 1;
  }
  return (bool)bVar9;
}

Assistant:

bool CanInitializeByZeroing(const FieldDescriptor* field,
                            const Options& options,
                            MessageSCCAnalyzer* scc_analyzer) {
  static_assert(
      std::numeric_limits<float>::is_iec559 &&
          std::numeric_limits<double>::is_iec559,
      "proto / abseil requires iec559, which has zero initialized floats.");

  if (field->is_repeated() || field->is_extension()) return false;
  switch (field->cpp_type()) {
    case FieldDescriptor::CPPTYPE_ENUM:
      return field->default_value_enum()->number() == 0;
    case FieldDescriptor::CPPTYPE_INT32:
      return field->default_value_int32() == 0;
    case FieldDescriptor::CPPTYPE_INT64:
      return field->default_value_int64() == 0;
    case FieldDescriptor::CPPTYPE_UINT32:
      return field->default_value_uint32() == 0;
    case FieldDescriptor::CPPTYPE_UINT64:
      return field->default_value_uint64() == 0;
    case FieldDescriptor::CPPTYPE_FLOAT:
      return field->default_value_float() == 0;
    case FieldDescriptor::CPPTYPE_DOUBLE:
      return field->default_value_double() == 0;
    case FieldDescriptor::CPPTYPE_BOOL:
      return field->default_value_bool() == false;
    case FieldDescriptor::CPPTYPE_MESSAGE:
      return true;
    default:
      return false;
  }
}